

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

wstring * __thiscall
PDA::Transducer::Generator::add_abi_cxx11_
          (wstring *__return_storage_ptr__,Generator *this,int source,Register *dest,wchar_t suff)

{
  undefined4 in_register_00000014;
  wchar_t local_d4;
  wstring local_b8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_98;
  wstring local_78;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  allocator<wchar_t> local_26;
  undefined1 local_25;
  wchar_t local_24;
  Register *pRStack_20;
  wchar_t suff_local;
  Register *dest_local;
  wstring *pwStack_10;
  int source_local;
  wstring *result;
  
  pRStack_20 = (Register *)CONCAT44(in_register_00000014,source);
  local_24 = (wchar_t)dest;
  dest_local._4_4_ = (int)this;
  local_25 = 0;
  pwStack_10 = __return_storage_ptr__;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)__return_storage_ptr__,L"add",&local_26);
  std::allocator<wchar_t>::~allocator(&local_26);
  if (local_24 == L'\0') {
    local_d4 = registerSuffix(pRStack_20);
  }
  else {
    local_d4 = local_24;
  }
  std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,local_d4);
  std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,L'\t');
  std::__cxx11::to_wstring(&local_78,dest_local._4_4_);
  std::operator+(&local_58,L'$',&local_78);
  std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,(wstring *)&local_58);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  std::__cxx11::wstring::~wstring((wstring *)&local_78);
  Register::toString_abi_cxx11_(&local_b8,pRStack_20);
  std::operator+(&local_98,L",\t",&local_b8);
  std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,(wstring *)&local_98);
  std::__cxx11::wstring::~wstring((wstring *)&local_98);
  std::__cxx11::wstring::~wstring((wstring *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::wstring Generator::add(const int source, const Register &dest, const wchar_t suff)
{
    std::wstring result = L"add";
    result += suff == L'\0' ? registerSuffix(dest) : suff;
    result += L'\t';
    result += L'$' + std::to_wstring(source);
    result += L",\t" + dest.toString();
    return result;
}